

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

void Gia_ManCorrRemapSimInfo(Gia_Man_t *p,Vec_Ptr_t *vInfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  void *pvVar4;
  void *pvVar5;
  bool bVar6;
  int local_40;
  int nWords;
  int w;
  int i;
  uint *pInfoRepr;
  uint *pInfoObj;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vInfo_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_PtrReadWordsSimInfo(vInfo);
  nWords = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p);
    bVar6 = false;
    if (nWords < iVar2) {
      iVar2 = Gia_ManPiNum(p);
      pRepr = Gia_ManCi(p,iVar2 + nWords);
      bVar6 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjId(p,pRepr);
    pObj_00 = Gia_ObjReprObj(p,iVar2);
    if (pObj_00 != (Gia_Obj_t *)0x0) {
      iVar2 = Gia_ObjId(p,pRepr);
      iVar2 = Gia_ObjFailed(p,iVar2);
      if (iVar2 == 0) {
        pvVar4 = Vec_PtrEntry(vInfo,nWords);
        for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
          if (*(int *)((long)pvVar4 + (long)local_40 * 4) != 0) {
            __assert_fail("pInfoObj[w] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                          ,0x151,"void Gia_ManCorrRemapSimInfo(Gia_Man_t *, Vec_Ptr_t *)");
          }
        }
        iVar2 = Gia_ObjIsConst0(pObj_00);
        if (iVar2 == 0) {
          iVar2 = Gia_ObjIsRo(p,pObj_00);
          if (iVar2 == 0) {
            __assert_fail("Gia_ObjIsRo(p, pRepr)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                          ,0x155,"void Gia_ManCorrRemapSimInfo(Gia_Man_t *, Vec_Ptr_t *)");
          }
          iVar2 = Gia_ObjCioId(pObj_00);
          iVar3 = Gia_ManPiNum(p);
          pvVar5 = Vec_PtrEntry(vInfo,iVar2 - iVar3);
          for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
            *(undefined4 *)((long)pvVar4 + (long)local_40 * 4) =
                 *(undefined4 *)((long)pvVar5 + (long)local_40 * 4);
          }
        }
      }
    }
    nWords = nWords + 1;
  }
  return;
}

Assistant:

void Gia_ManCorrRemapSimInfo( Gia_Man_t * p, Vec_Ptr_t * vInfo )
{
    Gia_Obj_t * pObj, * pRepr;
    unsigned * pInfoObj, * pInfoRepr;
    int i, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    Gia_ManForEachRo( p, pObj, i )
    {
        // skip ROs without representatives
        pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
        if ( pRepr == NULL || Gia_ObjFailed(p, Gia_ObjId(p,pObj)) )
            continue;
        pInfoObj = (unsigned *)Vec_PtrEntry( vInfo, i );
        for ( w = 0; w < nWords; w++ )
            assert( pInfoObj[w] == 0 );
        // skip ROs with constant representatives
        if ( Gia_ObjIsConst0(pRepr) )
            continue;
        assert( Gia_ObjIsRo(p, pRepr) );
//        Abc_Print( 1, "%d -> %d    ", i, Gia_ObjId(p, pRepr) );
        // transfer info from the representative
        pInfoRepr = (unsigned *)Vec_PtrEntry( vInfo, Gia_ObjCioId(pRepr) - Gia_ManPiNum(p) );
        for ( w = 0; w < nWords; w++ )
            pInfoObj[w] = pInfoRepr[w];
    }
//    Abc_Print( 1, "\n" );
}